

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O2

void save_roller_data(birther *tosave)

{
  uint uVar1;
  long lVar2;
  player *ppVar3;
  undefined1 auVar4 [16];
  
  tosave->race = player->race;
  ppVar3 = player;
  tosave->class = player->class;
  tosave->age = ppVar3->age;
  uVar1._0_2_ = ppVar3->ht_birth;
  uVar1._2_2_ = ppVar3->wt_birth;
  auVar4 = pshuflw(ZEXT416(uVar1),ZEXT416(uVar1),0xe1);
  tosave->wt = (short)auVar4._0_4_;
  tosave->ht = (short)((uint)auVar4._0_4_ >> 0x10);
  tosave->au = ppVar3->au_birth;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    tosave->stat[lVar2] = ppVar3->stat_birth[lVar2];
  }
  if (tosave->history != (char *)0x0) {
    string_free(tosave->history);
    ppVar3 = player;
  }
  tosave->history = ppVar3->history;
  ppVar3->history = (char *)0x0;
  my_strcpy(tosave->name,ppVar3->full_name,0x20);
  return;
}

Assistant:

static void save_roller_data(birther *tosave)
{
	int i;

	/* Save the data */
	tosave->race = player->race;
	tosave->class = player->class;
	tosave->age = player->age;
	tosave->wt = player->wt_birth;
	tosave->ht = player->ht_birth;
	tosave->au = player->au_birth;

	/* Save the stats */
	for (i = 0; i < STAT_MAX; i++)
		tosave->stat[i] = player->stat_birth[i];

	if (tosave->history) {
		string_free(tosave->history);
	}
	tosave->history = player->history;
	player->history = NULL;
	my_strcpy(tosave->name, player->full_name, sizeof(tosave->name));
}